

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *b;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  uint32_t j;
  uint uVar9;
  byte *last;
  size_type sVar10;
  size_t sVar11;
  size_type __n;
  ulong __n_00;
  SourceSnippet *pSVar12;
  ulong uVar13;
  uint32_t c;
  int error;
  char buf [4];
  int unused;
  SmallVector<char,_40UL> buffer;
  uint32_t local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  int local_f4;
  SourceSnippet *local_f0;
  size_t local_e8;
  undefined1 local_e0 [24];
  char local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  reverse_iterator<char_*> local_b8;
  uint32_t local_b0;
  int local_ac;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *local_a8;
  char *local_a0;
  SmallVectorBase<char> local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  char *local_48;
  size_type local_40;
  reverse_iterator<char_*> local_38;
  
  local_a0 = sourceLine._M_str;
  sVar11 = sourceLine._M_len;
  local_48 = (this->byteToColumn).super_SmallVectorBase<int>.firstElement;
  (this->byteToColumn).super_SmallVectorBase<int>.data_ = (pointer)local_48;
  (this->byteToColumn).super_SmallVectorBase<int>.len = 0;
  (this->byteToColumn).super_SmallVectorBase<int>.cap = 10;
  local_a8 = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)&this->invalidRanges;
  local_50 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.
             firstElement;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.data_ =
       (pointer)local_50;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len = 0;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.cap = 4;
  local_c0 = &this->snippetLine;
  local_58 = &(this->snippetLine).field_2;
  (this->snippetLine)._M_dataplus._M_p = (pointer)local_58;
  (this->snippetLine)._M_string_length = 0;
  (this->snippetLine).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->highlightLine).field_2;
  (this->highlightLine)._M_dataplus._M_p = (pointer)paVar1;
  (this->highlightLine)._M_string_length = 0;
  (this->highlightLine).field_2._M_local_buf[0] = '\0';
  local_f0 = this;
  local_b0 = tabStop;
  SmallVectorBase<int>::resizeImpl<slang::SmallVectorBase<int>::ValueInitTag>
            ((SmallVectorBase<int> *)this,sVar11 + 1,(ValueInitTag *)local_98);
  sVar10 = (this->byteToColumn).super_SmallVectorBase<int>.len;
  local_e8 = sVar11;
  if (sVar10 != 0) {
    memset((this->byteToColumn).super_SmallVectorBase<int>.data_,0xff,sVar10 << 2);
  }
  sVar11 = local_e8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (local_c0,local_e8);
  local_98[0].data_ = local_98[0].firstElement;
  local_98[0].len = 0;
  local_98[0].cap = 0x28;
  __n = 0;
  local_108 = &this->highlightLine;
  if (sVar11 != 0) {
    uVar13 = 0;
    local_100 = paVar1;
    do {
      (this->byteToColumn).super_SmallVectorBase<int>.data_[uVar13] = (int)__n;
      local_98[0].len = 0;
      local_40 = __n;
      if (local_a0[uVar13] == '\t') {
        uVar9 = 0;
        uVar4 = 0;
        if (uVar13 != 0) {
          uVar4 = 0;
          uVar7 = uVar13;
          do {
            if (local_a0[uVar7 - 1] == '\t') goto LAB_001b67e0;
            uVar7 = uVar7 - 1;
            uVar4 = uVar4 + 1;
          } while (uVar7 != 0);
          uVar4 = (uint)uVar13;
        }
LAB_001b67e0:
        uVar4 = local_b0 - uVar4 % local_b0;
        uVar13 = uVar13 + 1;
        do {
          local_e0[0] = 0x20;
          SmallVectorBase<char>::emplace_back<char>(local_98,(char *)local_e0);
          uVar9 = uVar9 + 1;
          sVar10 = local_98[0].len;
        } while (uVar9 < uVar4);
      }
      else {
        b = (byte *)(local_a0 + uVar13);
        if (local_e8 < uVar13 + 4) {
          local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
          __n_00 = local_e8 - uVar13;
          memcpy((SmallVectorBase<char> *)local_e0,b,__n_00);
          pcVar6 = utf8Decode((char *)local_e0,&local_10c,&local_f4,&local_ac);
          uVar7 = (long)pcVar6 - (long)local_e0;
          if (__n_00 < uVar7) {
            uVar7 = __n_00;
          }
          last = b + uVar7;
        }
        else {
          last = (byte *)utf8Decode((char *)b,&local_10c,&local_f4,&local_ac);
        }
        if (local_f4 == 0) {
          bVar3 = isPrintableUnicode(local_10c);
          uVar13 = (long)last - (long)local_a0;
          if (bVar3) {
            SmallVectorBase<char>::append<const_char_*>(local_98,(char *)b,(char *)last);
            iVar5 = charWidthUnicode(local_10c);
            sVar10 = (long)iVar5;
            goto LAB_001b693e;
          }
          local_e0._0_8_ = local_c8;
          local_e0._8_8_ = 0;
          local_e0._16_8_ = 8;
          do {
            local_b8.current._0_1_ = "0123456789ABCDEF"[local_10c & 0xf];
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)local_e0,(char *)&local_b8);
            uVar4 = local_10c >> 4;
            bVar3 = 0xf < local_10c;
            local_10c = uVar4;
          } while (bVar3);
          sVar10 = local_98[0].len + 3;
          SmallVectorBase<char>::reserve(local_98,sVar10);
          pSVar12 = local_f0;
          *(undefined2 *)(local_98[0].data_ + local_98[0].len) = 0x553c;
          local_98[0].data_[local_98[0].len + 2] = '+';
          local_b8.current = (char *)(local_e0._0_8_ + local_e0._8_8_);
          local_38.current = (char *)local_e0._0_8_;
          local_98[0].len = sVar10;
          SmallVectorBase<char>::append<std::reverse_iterator<char_*>_>
                    (local_98,&local_b8,&local_38);
          local_b8.current._0_1_ = 0x3e;
          SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&local_b8);
          sVar10 = local_98[0].len;
          if ((char *)local_e0._0_8_ != local_c8) {
            operator_delete((void *)local_e0._0_8_);
          }
        }
        else {
          bVar2 = *b;
          sVar10 = local_98[0].len + 4;
          SmallVectorBase<char>::reserve(local_98,sVar10);
          uVar13 = uVar13 + 1;
          lVar8 = 0;
          do {
            local_98[0].data_[lVar8 + local_98[0].len] = "<XX>"[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_98[0].data_[1] = "0123456789ABCDEF"[bVar2 >> 4];
          local_98[0].data_[2] = "0123456789ABCDEF"[bVar2 & 0xf];
          pSVar12 = local_f0;
          local_98[0].len = sVar10;
        }
        local_e0._0_8_ = (pSVar12->snippetLine)._M_string_length;
        local_e0._8_8_ = local_98[0].len;
        SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
        emplace_back<std::pair<unsigned_long,unsigned_long>>
                  (local_a8,(pair<unsigned_long,_unsigned_long> *)local_e0);
      }
LAB_001b693e:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_c0,local_98[0].data_,local_98[0].len);
      __n = local_40 + sVar10;
      this = local_f0;
    } while (uVar13 < local_e8);
  }
  (this->byteToColumn).super_SmallVectorBase<int>.data_[local_e8] = (int)__n;
  local_e0._0_8_ = local_e0 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,__n,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
            );
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if (local_98[0].data_ != local_98[0].firstElement) {
    operator_delete(local_98[0].data_);
  }
  return;
}

Assistant:

SourceSnippet(std::string_view sourceLine, uint32_t tabStop) {
        SLANG_ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }